

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task_scheduler.cpp
# Opt level: O2

idx_t __thiscall duckdb::TaskScheduler::GetProducerCount(TaskScheduler *this)

{
  pointer this_00;
  size_t sVar1;
  
  this_00 = unique_ptr<duckdb::ConcurrentQueue,_std::default_delete<duckdb::ConcurrentQueue>,_true>
            ::operator->(&this->queue);
  sVar1 = duckdb_moodycamel::
          ConcurrentQueue<duckdb::shared_ptr<duckdb::Task,_true>,_duckdb_moodycamel::ConcurrentQueueDefaultTraits>
          ::size_producers_approx(&this_00->q);
  return sVar1;
}

Assistant:

idx_t TaskScheduler::GetProducerCount() const {
#ifndef DUCKDB_NO_THREADS
	return queue->q.size_producers_approx();
#else
	return queue->q.size();
#endif
}